

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void AccessibleCompatible(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  uint local_1c;
  int msgcode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level1_Enabled(doc);
  if (BVar1 != no) {
    local_1c = 0;
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_SCRIPT))
    {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_OBJECT)
         ) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
           (node->tag->id != TidyTag_EMBED)) {
          if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
             (node->tag->id == TidyTag_APPLET)) {
            local_1c = 0x2ea;
          }
        }
        else {
          local_1c = 0x2eb;
        }
      }
      else {
        local_1c = 0x2e9;
      }
    }
    else {
      local_1c = 0x2e8;
    }
    if (local_1c != 0) {
      prvTidyReportAccessError(doc,node,local_1c);
    }
  }
  return;
}

Assistant:

static void AccessibleCompatible( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsSCRIPT(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_OBJECT;
        else if ( nodeIsEMBED(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_EMBED;
        else if ( nodeIsAPPLET(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_APPLET;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}